

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O3

CTypeID lj_ccall_ctid_vararg(CTState *cts,cTValue *o)

{
  ushort uVar1;
  CTypeID CVar2;
  uint uVar3;
  uint uVar4;
  
  if ((o->field_2).it < 0xffff0000) {
    return 0xe;
  }
  uVar3 = (o->field_2).it & 0xffff;
  if (uVar3 - 0xfffd < 2) {
    return 3;
  }
  if (uVar3 == 0xfffb) {
    return 0x13;
  }
  if (uVar3 == 0xfff5) {
    uVar1 = *(ushort *)((ulong)(o->u32).lo + 6);
    uVar4 = (uint)uVar1;
    uVar3 = cts->tab[uVar1].info;
    if ((uVar3 & 0xfc000000) == 0x30000000) {
      uVar4 = uVar3 & 0xffff;
    }
    else if ((uVar3 >> 0x1c != 6) && (uVar3 >> 0x1c != 1)) {
      if (((uVar3 & 0xf4000000) == 0x4000000) && (cts->tab[uVar1].size == 4)) {
        return 0xe;
      }
      return (uint)uVar1;
    }
    CVar2 = lj_ctype_intern(cts,uVar4 | 0x20030000,8);
    return CVar2;
  }
  return 0x11;
}

Assistant:

CTypeID lj_ccall_ctid_vararg(CTState *cts, cTValue *o)
{
  if (tvisnumber(o)) {
    return CTID_DOUBLE;
  } else if (tviscdata(o)) {
    CTypeID id = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, id);
    if (ctype_isrefarray(s->info)) {
      return lj_ctype_intern(cts,
	       CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(s->info)), CTSIZE_PTR);
    } else if (ctype_isstruct(s->info) || ctype_isfunc(s->info)) {
      /* NYI: how to pass a struct by value in a vararg argument? */
      return lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR);
    } else if (ctype_isfp(s->info) && s->size == sizeof(float)) {
      return CTID_DOUBLE;
    } else {
      return id;
    }
  } else if (tvisstr(o)) {
    return CTID_P_CCHAR;
  } else if (tvisbool(o)) {
    return CTID_BOOL;
  } else {
    return CTID_P_VOID;
  }
}